

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImU32 ImHashStr(char *data_p,size_t data_size,ImU32 seed)

{
  byte bVar1;
  uint uVar2;
  uchar c_1;
  uchar c;
  ImU32 *crc32_lut;
  uchar *data;
  ImU32 crc;
  ImU32 seed_local;
  size_t data_size_local;
  char *data_p_local;
  
  uVar2 = seed ^ 0xffffffff;
  data = (uchar *)data_p;
  crc = uVar2;
  data_size_local = data_size;
  if (data_size == 0) {
    while( true ) {
      bVar1 = *data;
      if (bVar1 == 0) break;
      if (((bVar1 == 0x23) && (data[1] == '#')) && (data[2] == '#')) {
        crc = uVar2;
      }
      data = data + 1;
      crc = crc >> 8 ^ GCrc32LookupTable[crc & 0xff ^ (uint)bVar1];
    }
  }
  else {
    while (data_size_local != 0) {
      bVar1 = *data;
      if (((bVar1 == 0x23) && (1 < data_size_local - 1)) && ((data[1] == '#' && (data[2] == '#'))))
      {
        crc = uVar2;
      }
      data = data + 1;
      crc = crc >> 8 ^ GCrc32LookupTable[crc & 0xff ^ (uint)bVar1];
      data_size_local = data_size_local - 1;
    }
  }
  return crc ^ 0xffffffff;
}

Assistant:

ImU32 ImHashStr(const char* data_p, size_t data_size, ImU32 seed)
{
    seed = ~seed;
    ImU32 crc = seed;
    const unsigned char* data = (const unsigned char*)data_p;
    const ImU32* crc32_lut = GCrc32LookupTable;
    if (data_size != 0)
    {
        while (data_size-- != 0)
        {
            unsigned char c = *data++;
            if (c == '#' && data_size >= 2 && data[0] == '#' && data[1] == '#')
                crc = seed;
            crc = (crc >> 8) ^ crc32_lut[(crc & 0xFF) ^ c];
        }
    }
    else
    {
        while (unsigned char c = *data++)
        {
            if (c == '#' && data[0] == '#' && data[1] == '#')
                crc = seed;
            crc = (crc >> 8) ^ crc32_lut[(crc & 0xFF) ^ c];
        }
    }
    return ~crc;
}